

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_unmap_mesh.cpp
# Opt level: O2

void Omega_h::unmap_parents
               (Mesh *old_mesh,Mesh *new_mesh,LOs *new_ents2old_ents_a,
               Few<Omega_h::Read<int>,_4> *old_ents2new_ents)

{
  byte bVar1;
  int iVar2;
  Int IVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint size_in;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_289;
  Write<signed_char> *local_288;
  Write<signed_char> new_parent_code;
  Write<int> new_parent_idx;
  LOs new_ents2old_ents;
  Write<int> local_230;
  Write<signed_char> local_220;
  Write<int> local_210;
  Write<signed_char> local_200;
  Parents old_parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  type functor;
  undefined1 local_120 [40];
  long local_f8;
  Write<int> local_f0;
  Few<Omega_h::Read<int>,_4> local_e0;
  Write<signed_char> WStack_a0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Parents local_50;
  
  local_288 = &functor.new_parent_code;
  lVar7 = 1;
  while( true ) {
    IVar3 = Mesh::dim(new_mesh);
    if (IVar3 < lVar7) break;
    Write<int>::Write(&new_ents2old_ents.write_,&new_ents2old_ents_a[lVar7].write_);
    if (((ulong)new_ents2old_ents.write_.shared_alloc_.alloc & 1) == 0) {
      uVar4 = (new_ents2old_ents.write_.shared_alloc_.alloc)->size;
    }
    else {
      uVar4 = (ulong)new_ents2old_ents.write_.shared_alloc_.alloc >> 3;
    }
    std::__cxx11::string::string((string *)local_120,"parent idx",(allocator *)&functor);
    size_in = (uint)(uVar4 >> 2);
    Write<int>::Write(&new_parent_idx,size_in,-1,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120
                     );
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::string((string *)local_120,"parent code",(allocator *)&functor);
    Write<signed_char>::Write
              (&new_parent_code,size_in,'\0',
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    Mesh::ask_parents(&old_parents,old_mesh,(Int)lVar7);
    Write<int>::Write((Write<int> *)&functor,&new_ents2old_ents.write_);
    Parents::Parents(&functor.old_parents,&old_parents);
    Write<int>::Write(&functor.new_parent_idx,&new_parent_idx);
    Few<Omega_h::Read<int>,_4>::Few(&functor.old_ents2new_ents,old_ents2new_ents);
    Write<signed_char>::Write(local_288,&new_parent_code);
    std::__cxx11::string::string
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
               ,&local_289);
    std::operator+(&local_1d0,&local_70,":");
    std::__cxx11::to_string(&local_90,0x54);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   &local_1d0,&local_90);
    begin_code("parallel_for",(char *)local_120._0_8_);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_70);
    if (0 < (int)size_in) {
      entering_parallel = 1;
      Write<int>::Write((Write<int> *)local_120,(Write<int> *)&functor);
      Parents::Parents((Parents *)(local_120 + 0x10),&functor.old_parents);
      Write<int>::Write(&local_f0,&functor.new_parent_idx);
      Few<Omega_h::Read<int>,_4>::Few(&local_e0,&functor.old_ents2new_ents);
      Write<signed_char>::Write(&WStack_a0,local_288);
      entering_parallel = 0;
      for (uVar4 = 0; (size_in & 0x7fffffff) != uVar4; uVar4 = uVar4 + 1) {
        lVar5 = (long)*(int *)(local_120._8_8_ + uVar4 * 4);
        lVar6 = (long)*(int *)(local_120._24_8_ + lVar5 * 4);
        if (-1 < lVar6) {
          bVar1 = *(byte *)(local_f8 + lVar5);
          iVar2 = *(int *)(*(long *)((long)&local_e0.array_[0].write_.shared_alloc_.direct_ptr +
                                    (ulong)((bVar1 & 3) << 4)) + lVar6 * 4);
          *(int *)((long)local_f0.shared_alloc_.direct_ptr + uVar4 * 4) = iVar2;
          if (-1 < iVar2) {
            *(byte *)((long)WStack_a0.shared_alloc_.direct_ptr + uVar4) = bVar1;
          }
        }
      }
      unmap_parents(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>*,Omega_h::Few<Omega_h::Read<int>,4>)
      ::$_0::~__0((__0 *)local_120);
    }
    ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
    Write<int>::Write(&local_210,&new_parent_idx);
    Read<int>::Read((Read<signed_char> *)&local_230,&local_210);
    Write<signed_char>::Write(&local_220,&new_parent_code);
    Read<signed_char>::Read((Read<signed_char> *)&local_200,&local_220);
    Parents::Parents(&local_50,(LOs *)&local_230,(Read<signed_char> *)&local_200);
    Mesh::set_parents(new_mesh,(Int)lVar7,&local_50);
    Parents::~Parents(&local_50);
    Write<signed_char>::~Write(&local_200);
    Write<signed_char>::~Write(&local_220);
    Write<int>::~Write(&local_230);
    Write<int>::~Write(&local_210);
    unmap_parents(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>*,Omega_h::Few<Omega_h::Read<int>,4>)
    ::$_0::~__0((__0 *)&functor);
    Parents::~Parents(&old_parents);
    Write<signed_char>::~Write(&new_parent_code);
    Write<int>::~Write(&new_parent_idx);
    Write<int>::~Write(&new_ents2old_ents.write_);
    lVar7 = lVar7 + 1;
  }
  return;
}

Assistant:

void unmap_parents(Mesh* old_mesh, Mesh* new_mesh,
    LOs new_ents2old_ents_a[], Few<LOs, 4> old_ents2new_ents) {
  for (Int ent_dim = 1; ent_dim <= new_mesh->dim(); ++ent_dim) {
    auto new_ents2old_ents = new_ents2old_ents_a[ent_dim];
    auto nnew_ents = new_ents2old_ents.size();
    Write<LO> new_parent_idx(nnew_ents, -1, "parent idx");
    Write<Byte> new_parent_code(nnew_ents, 0, "parent code");
    auto old_parents = old_mesh->ask_parents(ent_dim);
    auto functor = OMEGA_H_LAMBDA(LO new_ent) {
      auto old_ent = new_ents2old_ents[new_ent];
      auto old_parent_idx = old_parents.parent_idx[old_ent];
      auto old_parent_code = old_parents.codes[old_ent];
      if (old_parent_idx > -1) {
        auto old_parent_dim = amr::code_parent_dim(old_parent_code);
        new_parent_idx[new_ent] =
          old_ents2new_ents[old_parent_dim][old_parent_idx];
        if (new_parent_idx[new_ent] > -1)
          new_parent_code[new_ent] = old_parent_code;
      }
    };
    parallel_for(nnew_ents, std::move(functor));
    new_mesh->set_parents(ent_dim, Parents{new_parent_idx, new_parent_code});
  }
}